

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

void __thiscall DirectionCone_VectorInCone_Test::TestBody(DirectionCone_VectorInCone_Test *this)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint64_t uVar8;
  char *pcVar9;
  int iVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined4 extraout_XMM0_Db;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 extraout_var [60];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  AssertionResult gtest_ar;
  DirectionCone dc;
  AssertHelper local_1f8;
  float local_1ec;
  Vector3<float> local_1e8;
  float local_1dc;
  internal local_1d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  RNG local_1c8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  uint64_t local_188;
  float local_180 [2];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined1 local_148 [16];
  ulong local_138;
  Tuple3<pbrt::Vector3,_float> local_130;
  DirectionCone local_120;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_1c8.state = 0x853c49e6748fea9b;
  local_1c8.inc = 0xda3e39cb94b95bdb;
  local_138 = 0;
  do {
    RandomCone(&local_120,&local_1c8);
    local_108._4_4_ = local_120.cosTheta;
    local_108._0_4_ = local_120.cosTheta;
    local_108._8_4_ = local_120.cosTheta;
    local_108._12_4_ = local_120.cosTheta;
    auVar28._8_4_ = 0x3f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar28._12_4_ = 0x3f800000;
    auVar27._8_4_ = 0x80000000;
    auVar27._0_8_ = 0x8000000080000000;
    auVar27._12_4_ = 0x80000000;
    iVar6 = 0;
    local_188 = local_1c8.inc;
    auVar18 = vfnmadd213ss_fma(local_108,local_108,auVar28);
    auVar18 = vmaxss_avx(auVar18,ZEXT416(0));
    local_58._8_8_ = 0;
    local_58._0_4_ = local_120.w.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58._4_4_ = local_120.w.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar2 = vcmpss_avx512f(local_108,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar4 = (bool)((byte)uVar2 & 1);
    local_48 = ZEXT416((uint)local_120.w.super_Tuple3<pbrt::Vector3,_float>.z);
    local_1a8 = local_120.w.super_Tuple3<pbrt::Vector3,_float>.x;
    local_88 = local_1a8 * local_120.cosTheta;
    fVar11 = local_120.w.super_Tuple3<pbrt::Vector3,_float>.y;
    fStack_84 = fVar11 * local_120.cosTheta;
    fStack_80 = local_120.cosTheta * 0.0;
    fStack_7c = local_120.cosTheta * 0.0;
    local_e8 = vmovshdup_avx(local_58);
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    local_98 = vshufps_avx(local_58,local_58,0xe1);
    auVar13._0_4_ = local_1a8 * local_1a8;
    auVar13._4_4_ = fVar11 * fVar11;
    auVar13._8_8_ = 0;
    auVar12 = vshufps_avx(auVar13,auVar13,0xe1);
    local_a8 = vhaddps_avx(auVar13,auVar13);
    local_78._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
    local_78._8_4_ = auVar18._8_4_ ^ 0x80000000;
    local_78._12_4_ = auVar18._12_4_ ^ 0x80000000;
    auVar18 = vminss_avx(auVar28,auVar18);
    local_1b4 = local_120.w.super_Tuple3<pbrt::Vector3,_float>.z * local_120.cosTheta;
    local_1dc = auVar18._0_4_;
    auVar18 = vminss_avx(auVar28,local_108);
    fStack_ac = local_120.w.super_Tuple3<pbrt::Vector3,_float>.z *
                local_120.w.super_Tuple3<pbrt::Vector3,_float>.z;
    local_1b0 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar18._0_4_);
    local_b8 = auVar12._0_4_ + fStack_ac;
    fStack_b4 = auVar12._4_4_ + fStack_ac;
    fStack_b0 = auVar12._8_4_ + fStack_ac;
    fStack_ac = auVar12._12_4_ + fStack_ac;
    local_1ac = local_e8._0_4_;
    auVar12 = vpternlogd_avx512vl(auVar28,local_48,auVar27,0xf8);
    fVar11 = auVar12._0_4_;
    fVar23 = -1.0 / (local_120.w.super_Tuple3<pbrt::Vector3,_float>.z + fVar11);
    local_194 = local_1a8 * local_1ac * fVar23;
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)(local_1a8 * local_1a8 * fVar11)),ZEXT416((uint)fVar23),
                              auVar28);
    local_198 = auVar18._0_4_;
    local_19c = local_194 * fVar11;
    local_1a0 = local_1a8 * -fVar11;
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)(local_1ac * local_1ac)),ZEXT416((uint)fVar23),auVar12);
    local_1ac = local_1ac * local_1b0;
    local_1a4 = auVar18._0_4_;
    local_1a8 = local_1a8 * local_1b0;
    local_1b0 = local_120.w.super_Tuple3<pbrt::Vector3,_float>.z * local_1b0;
    uVar8 = local_1c8.state;
    do {
      uVar7 = uVar8 * 0x5851f42d4c957f2d + local_188;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar8;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar7;
      auVar18 = vpunpcklqdq_avx(auVar20,auVar17);
      auVar12 = vpsrlvq_avx2(auVar18,_DAT_006015b0);
      auVar13 = vpsrlvq_avx2(auVar18,_DAT_006015a0);
      auVar18 = vpsrlq_avx(auVar18,0x3b);
      auVar18 = vpshufd_avx(auVar18,0xe8);
      auVar12 = vpshufd_avx(auVar13 ^ auVar12,0xe8);
      auVar18 = vprorvd_avx512vl(auVar12,auVar18);
      auVar12 = vcvtudq2ps_avx512vl(auVar18);
      auVar18._8_4_ = 0x2f800000;
      auVar18._0_8_ = 0x2f8000002f800000;
      auVar18._12_4_ = 0x2f800000;
      auVar13 = vmulps_avx512vl(auVar12,auVar18);
      auVar12._8_4_ = 0x3f7fffff;
      auVar12._0_8_ = 0x3f7fffff3f7fffff;
      auVar12._12_4_ = 0x3f7fffff;
      uVar1 = vcmpps_avx512vl(auVar13,auVar12,1);
      auVar18 = vmovshdup_avx(auVar13);
      bVar3 = (byte)(uVar1 >> 1);
      local_178 = vfmadd132ss_fma(ZEXT416((uint)(bVar3 & 1) * auVar18._0_4_ +
                                          (uint)!(bool)(bVar3 & 1) * 0x3f7fffff),
                                  SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
      auVar18 = vfnmadd213ss_fma(local_178,local_178,SUB6416(ZEXT464(0x3f800000),0));
      auVar18 = vmaxss_avx(auVar18,ZEXT416(0));
      local_148 = vsqrtss_avx(auVar18,auVar18);
      fVar11 = (float)((uint)((byte)uVar1 & 1) * (int)(auVar13._0_4_ * 6.2831855) +
                      (uint)!(bool)((byte)uVar1 & 1) * 0x40c90fda);
      local_168 = ZEXT416((uint)fVar11);
      fVar11 = cosf(fVar11);
      local_158 = (double)CONCAT44(extraout_XMM0_Db,fVar11);
      auVar22._0_4_ = sinf((float)local_168._0_4_);
      auVar22._4_60_ = extraout_var;
      auVar18 = vinsertps_avx(auVar22._0_16_,ZEXT416((uint)local_158),0x10);
      local_d8._0_4_ = auVar18._0_4_ * (float)local_148._0_4_;
      local_d8._4_4_ = auVar18._4_4_ * (float)local_148._0_4_;
      local_d8._8_4_ = auVar18._8_4_ * (float)local_148._0_4_;
      local_d8._12_4_ = auVar18._12_4_ * (float)local_148._0_4_;
      local_c8 = vmovshdup_avx(local_d8);
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ * (float)local_d8._0_4_)),
                                local_c8,local_c8);
      auVar18 = vfmadd231ss_fma(auVar18,local_178,local_178);
      auVar18 = vsqrtss_avx(auVar18,auVar18);
      fVar11 = auVar18._0_4_;
      auVar21._4_4_ = fVar11;
      auVar21._0_4_ = fVar11;
      auVar21._8_4_ = fVar11;
      auVar21._12_4_ = fVar11;
      auVar31._0_4_ = local_178._0_4_ / fVar11;
      auVar31._4_12_ = local_178._4_12_;
      auVar18 = vdivps_avx(local_d8,auVar21);
      auVar12 = vmovshdup_avx(auVar18);
      auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_e8._0_4_ * auVar18._0_4_)),auVar12,local_58);
      auVar13 = vfmadd213ss_fma(local_48,auVar31,auVar28);
      if (auVar13._0_4_ <= (float)local_108._0_4_) {
        auVar27 = vshufps_avx(auVar18,auVar18,0xe1);
        auVar30._0_4_ = auVar27._0_4_ * local_b8;
        auVar30._4_4_ = auVar27._4_4_ * fStack_b4;
        auVar30._8_4_ = auVar27._8_4_ * fStack_b0;
        auVar30._12_4_ = auVar27._12_4_ * fStack_ac;
        auVar17 = ZEXT416((uint)(local_e8._0_4_ * auVar31._0_4_));
        auVar27 = vfmsub213ss_fma(local_48,auVar18,auVar17);
        auVar21 = vfnmadd231ss_fma(auVar17,auVar31,local_e8);
        auVar20 = ZEXT416((uint)(local_48._0_4_ * auVar12._0_4_));
        auVar17 = vfmsub213ss_fma(local_58,auVar31,auVar20);
        auVar20 = vfnmadd213ss_fma(auVar12,local_48,auVar20);
        fVar11 = auVar20._0_4_ + auVar17._0_4_;
        auVar20 = ZEXT416((uint)(local_58._0_4_ * auVar18._0_4_));
        auVar17 = vfmsub213ss_fma(local_e8,auVar12,auVar20);
        auVar20 = vfnmadd231ss_fma(auVar20,auVar18,local_58);
        auVar12 = ZEXT416((uint)(auVar27._0_4_ + auVar21._0_4_));
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar12,auVar12);
        auVar27 = ZEXT416((uint)(auVar17._0_4_ + auVar20._0_4_));
        auVar12 = vfmadd231ss_fma(auVar12,auVar27,auVar27);
        auVar12 = vsqrtss_avx(auVar12,auVar12);
        auVar28 = vfmsub213ss_fma(auVar28,local_48,
                                  ZEXT416((uint)(auVar31._0_4_ * (float)local_a8._0_4_)));
        fVar23 = (float)local_78._0_4_ / auVar12._0_4_;
        fVar11 = local_48._0_4_ * auVar31._0_4_;
        auVar31 = ZEXT416((uint)(auVar28._0_4_ * fVar23 + local_1b4));
        auVar24._4_4_ = fVar11;
        auVar24._0_4_ = fVar11;
        auVar24._8_4_ = fVar11;
        auVar24._12_4_ = fVar11;
        auVar18 = vfmadd231ps_fma(auVar24,auVar18,local_98);
        auVar18 = vfmsub213ps_fma(auVar18,local_58,auVar30);
        auVar25._0_4_ = auVar18._0_4_ * fVar23 + local_88;
        auVar25._4_4_ = auVar18._4_4_ * fVar23 + fStack_84;
        auVar25._8_4_ = auVar18._8_4_ * fVar23 + fStack_80;
        auVar25._12_4_ = auVar18._12_4_ * fVar23 + fStack_7c;
      }
      else {
        auVar25 = vshufps_avx(auVar18,auVar18,0xe1);
      }
      uVar8 = uVar7 * 0x5851f42d4c957f2d + local_188;
      local_130._0_8_ = vmovlps_avx(auVar25);
      local_130.z = auVar31._0_4_;
      if ((auVar13._0_4_ < (float)local_108._0_4_) || (local_120.empty != false)) {
        auVar29 = ZEXT464(0xbf800000);
        local_f8 = ZEXT816(0) << 0x20;
        auVar26 = ZEXT864(0) << 0x20;
        auVar22 = ZEXT864(0) << 0x20;
        iVar10 = 1000;
        local_1e8.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_1e8.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_1ec = local_130.z;
        local_68 = auVar25;
        do {
          local_158 = auVar22._0_8_;
          local_168._0_4_ = auVar29._0_4_;
          local_148 = auVar26._0_16_;
          dVar16 = (local_158 + 0.5) / 1000.0;
          local_190 = (float)((dVar16 + dVar16) * 3.1415927410125732);
          local_18c = cosf(local_190);
          local_18c = local_18c * local_1dc;
          fVar15 = sinf(local_190);
          fVar15 = fVar15 * local_1dc;
          fVar11 = local_18c * local_19c + fVar15 * local_1a4 + local_1ac;
          fVar23 = (local_18c * local_1a0 - fVar15 * (float)local_e8._0_4_) + local_1b0;
          auVar12 = ZEXT416((uint)(local_18c * local_198 + fVar15 * local_194 + local_1a8));
          auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (float)local_d8._0_4_)),auVar12,
                                    ZEXT416((uint)local_c8._0_4_));
          auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar23),ZEXT416((uint)local_178._0_4_));
          if ((float)local_168._0_4_ < auVar18._0_4_) {
            local_f8 = vinsertps_avx(auVar12,ZEXT416((uint)fVar11),0x10);
          }
          uVar2 = vcmpss_avx512f(ZEXT416((uint)local_168._0_4_),auVar18,1);
          bVar4 = (bool)((byte)uVar2 & 1);
          auVar18 = vmaxss_avx(auVar18,ZEXT416((uint)local_168._0_4_));
          auVar29 = ZEXT1664(auVar18);
          iVar10 = iVar10 + -1;
          auVar14._4_12_ = local_148._4_12_;
          auVar14._0_4_ = (float)((uint)bVar4 * (int)fVar23 + (uint)!bVar4 * local_148._0_4_);
          auVar26 = ZEXT1664(auVar14);
          auVar22 = ZEXT864((ulong)(local_158 + 1.0));
        } while (iVar10 != 0);
        local_1f8.data_ = (AssertHelperData *)&DAT_3feff7ced916872b;
        auVar19._0_4_ = local_f8._0_4_ * local_68._0_4_;
        auVar19._4_4_ = local_f8._4_4_ * local_68._4_4_;
        auVar19._8_4_ = local_f8._8_4_ * local_68._8_4_;
        auVar19._12_4_ = local_f8._12_4_ * local_68._12_4_;
        local_1e8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(local_f8);
        auVar18 = vmovshdup_avx(auVar19);
        auVar18 = vfmadd231ss_fma(auVar18,local_68,local_f8);
        auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_1ec),auVar14,auVar18);
        local_1ec = auVar18._0_4_;
        local_1e8.super_Tuple3<pbrt::Vector3,_float>.z = auVar14._0_4_;
        local_180[0] = local_1ec;
        testing::internal::CmpHelperGT<float,double>
                  (local_1d8,"Dot(wBest, wClosest)",".999",local_180,(double *)&local_1f8);
        if (local_1d8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1f8);
          pbrt::operator<<((ostream *)&(local_1f8.data_)->line,&local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_1f8.data_)->line," vs ",4);
          pbrt::operator<<((ostream *)&(local_1f8.data_)->line,(Vector3<float> *)&local_130);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_1f8.data_)->line,", dot ",6);
          std::ostream::_M_insert<double>((double)local_1ec);
          pcVar9 = "";
          if (local_1d0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = ((local_1d0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                     ,0x1d9,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_180,(Message *)&local_1f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_180);
          if (local_1f8.data_ != (AssertHelperData *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_1f8.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_1f8.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        auVar18 = vmovshdup_avx(auVar25);
        local_1e8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &DAT_3feff7ced916872b;
        auVar18 = vfmadd213ss_fma(local_c8,auVar25,
                                  ZEXT416((uint)(auVar18._0_4_ * (float)local_d8._0_4_)));
        auVar18 = vfmadd213ss_fma(local_178,auVar31,auVar18);
        local_1f8.data_._0_4_ = auVar18._0_4_;
        testing::internal::CmpHelperGT<float,double>
                  (local_1d8,"Dot(wClosest, wRandom)",".999",(float *)&local_1f8,
                   (double *)&local_1e8);
        if (local_1d8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1e8);
          pcVar9 = "";
          if (local_1d0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = ((local_1d0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                     ,0x1c6,pcVar9);
          testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_1e8);
          testing::internal::AssertHelper::~AssertHelper(&local_1f8);
          if ((long *)local_1e8.super_Tuple3<pbrt::Vector3,_float>._0_8_ != (long *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               ((long *)local_1e8.super_Tuple3<pbrt::Vector3,_float>._0_8_ != (long *)0x0)) {
              (**(code **)(*(long *)local_1e8.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 100);
    uVar5 = (int)local_138 + 1;
    local_138 = (ulong)uVar5;
    local_1c8.state = uVar8;
  } while (uVar5 != 100);
  return;
}

Assistant:

TEST(DirectionCone, VectorInCone) {
    RNG rng;
    for (int i = 0; i < 100; ++i) {
        DirectionCone dc = RandomCone(rng);

        for (int j = 0; j < 100; ++j) {
            Vector3f wRandom =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            Vector3f wClosest = dc.ClosestVectorInCone(wRandom);

            if (Inside(dc, wRandom))
                EXPECT_GT(Dot(wClosest, wRandom), .999);
            else {
                // Uniformly sample the circle at the cone's boundary and
                // keep the vector that's closest to wRandom.
                Float sinTheta = SafeSqrt(1 - dc.cosTheta * dc.cosTheta);
                Frame f = Frame::FromZ(dc.w);

                Vector3f wBest;
                Float bestDot = -1;
                const int nk = 1000;
                for (int k = 0; k < nk; ++k) {
                    Float phi = (k + .5) / nk * 2 * Pi;
                    Vector3f w = SphericalDirection(sinTheta, dc.cosTheta, phi);
                    w = f.FromLocal(w);
                    if (Dot(w, wRandom) > bestDot) {
                        wBest = w;
                        bestDot = Dot(w, wRandom);
                    }
                }
                EXPECT_GT(Dot(wBest, wClosest), .999)
                    << wBest << " vs " << wClosest << ", dot " << Dot(wBest, wClosest);
            }
        }
    }
}